

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

string * to_str_abi_cxx11_(string *__return_storage_ptr__,uint32_t c)

{
  string local_50;
  string local_30;
  
  to_str_abi_cxx11_(&local_30,(uint16_t)(c >> 0x10));
  to_str_abi_cxx11_(&local_50,(uint16_t)c);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_str(uint32_t c)
{ return to_str(uint16_t((0xFFFF0000 & c) >> 16)) + to_str(uint16_t(c)); }